

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_helper.c
# Opt level: O2

void arm_v7m_cpu_do_interrupt_aarch64(CPUState *cs)

{
  int *piVar1;
  byte *pbVar2;
  uint *puVar3;
  TranslationBlock *pTVar4;
  uint32_t addr;
  _Bool _Var5;
  _Bool _Var6;
  uint32_t uVar7;
  ARMMMUIdx AVar8;
  int iVar9;
  uint uVar10;
  tcg_target_ulong tVar11;
  tcg_target_ulong tVar12;
  long lVar13;
  ulong uVar14;
  undefined4 uVar15;
  long lVar16;
  CPUARMState_conflict *pCVar17;
  uint uVar18;
  uint uVar19;
  uint16_t local_60;
  char local_5d;
  uint32_t local_5c;
  ulong local_58;
  uint local_4c;
  ARMCPU_conflict1 *local_48;
  CPUARMState_conflict *local_40;
  TranslationBlock **local_38;
  
  iVar9 = cs->exception_index;
  if (iVar9 - 1U < 0x16) {
    pCVar17 = (CPUARMState_conflict *)(cs[1].tb_jmp_cache + 0x40b);
    switch(iVar9) {
    case 1:
      puVar3 = (uint *)((long)cs[1].tb_jmp_cache +
                       (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c) * 4 + 0x2b9c);
      *puVar3 = *puVar3 | 0x10000;
      break;
    case 2:
    case 5:
    case 7:
    case 0x14:
      break;
    case 3:
    case 4:
      uVar10 = *(uint *)((long)cs[1].tb_jmp_cache + 0x2c2c) & 0xf;
      if (uVar10 == 8) {
        uVar10 = *(uint *)((long)cs[1].tb_jmp_cache + 0x2b9c);
        if (iVar9 == 3) {
          *(uint *)((long)cs[1].tb_jmp_cache + 0x2b9c) = uVar10 | 0x100;
        }
        else {
          *(uint *)((long)cs[1].tb_jmp_cache + 0x2b9c) = uVar10 | 0x8200;
          *(undefined4 *)(cs[1].tb_jmp_cache + 0x577) = *(undefined4 *)(cs[1].tb_jmp_cache + 0x586);
        }
      }
      else if (uVar10 == 0xe) {
        if (iVar9 == 3) {
          uVar10 = *(uint *)((long)cs[1].tb_jmp_cache + 0x2bac);
          if (*(int *)(cs[1].tb_jmp_cache + 0x57c) == 0) {
            uVar10 = uVar10 | 1;
          }
          else {
            uVar10 = uVar10 | 0x10;
          }
          *(uint *)((long)cs[1].tb_jmp_cache + 0x2bac) = uVar10;
        }
        else {
          pbVar2 = (byte *)((long)cs[1].tb_jmp_cache + 0x2bac);
          *pbVar2 = *pbVar2 | 8;
        }
      }
      else if (uVar10 == 0xf) {
        if (*(int *)(cs[1].tb_jmp_cache + 0x57c) != 0) {
          __assert_fail("!env->v7m.secure",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/m_helper.c"
                        ,0x77e,"_Bool v7m_handle_execute_nsc(ARMCPU *)");
        }
        if ((*(byte *)((long)cs[1].tb_jmp_cache + 0x508c) & 0x20) == 0) {
          __assert_fail("arm_feature(env, ARM_FEATURE_M_SECURITY)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/m_helper.c"
                        ,0x77f,"_Bool v7m_handle_execute_nsc(ARMCPU *)");
        }
        AVar8 = arm_v7m_mmu_idx_for_secstate_aarch64(pCVar17,true);
        _Var5 = v7m_read_half_insn((ARMCPU_conflict1 *)cs,AVar8,
                                   *(uint32_t *)((long)cs[1].tb_jmp_cache + 0x2094),&local_60);
        if (_Var5) {
          if ((*(int *)(cs[1].tb_jmp_cache + 0x44f) != 0) && (local_60 == 0xe97f)) {
            _Var5 = v7m_read_half_insn((ARMCPU_conflict1 *)cs,AVar8,
                                       *(int *)((long)cs[1].tb_jmp_cache + 0x2094) + 2,&local_60);
            if (!_Var5) break;
            if (local_60 == 0xe97f) {
              *(byte *)(cs[1].tb_jmp_cache + 0x412) = *(byte *)(cs[1].tb_jmp_cache + 0x412) & 0xfe;
              *(byte *)(cs[1].tb_jmp_cache + 0x572) = *(byte *)(cs[1].tb_jmp_cache + 0x572) & 0xf7;
              switch_v7m_security_state(pCVar17,true);
              *(undefined4 *)((long)cs[1].tb_jmp_cache + 0x227c) = 0;
              piVar1 = (int *)((long)cs[1].tb_jmp_cache + 0x2094);
              *piVar1 = *piVar1 + 4;
              arm_rebuild_hflags_aarch64(pCVar17);
              return;
            }
          }
          pbVar2 = (byte *)((long)cs[1].tb_jmp_cache + 0x2bac);
          *pbVar2 = *pbVar2 | 1;
        }
      }
      else {
        uVar14 = (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c);
        uVar10 = *(uint *)((long)cs[1].tb_jmp_cache + uVar14 * 4 + 0x2b9c);
        if (iVar9 == 3) {
          *(uint *)((long)cs[1].tb_jmp_cache + uVar14 * 4 + 0x2b9c) = uVar10 | 1;
        }
        else {
          *(uint *)((long)cs[1].tb_jmp_cache + uVar14 * 4 + 0x2b9c) = uVar10 | 0x82;
          *(undefined4 *)
           ((long)cs[1].tb_jmp_cache + (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c) * 4 + 0x2bb0) =
               *(undefined4 *)(cs[1].tb_jmp_cache + 0x586);
        }
      }
      break;
    default:
      goto switchD_005b615b_caseD_6;
    case 8:
      uVar10 = *(uint *)((long)cs[1].tb_jmp_cache + 0x2094);
      if (0xfeffffff < uVar10) {
        return;
      }
      if (uVar10 < 0xfefffffe) {
        __assert_fail("env->regs[15] >= FNC_RETURN_MIN_MAGIC",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/m_helper.c"
                      ,0x856,"void arm_v7m_cpu_do_interrupt_aarch64(CPUState *)");
      }
      if ((*(byte *)((long)cs[1].tb_jmp_cache + 0x508c) & 0x20) == 0) {
        __assert_fail("arm_feature(env, ARM_FEATURE_M_SECURITY)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/m_helper.c"
                      ,0x857,"void arm_v7m_cpu_do_interrupt_aarch64(CPUState *)");
      }
      lVar13 = (ulong)((*(uint *)(cs[1].tb_jmp_cache + 0x572) & 2) * 2) + 0xb1c;
      if (*(int *)(cs[1].tb_jmp_cache + 0x579) != 0) {
        lVar13 = 0xb1c;
      }
      lVar16 = 0x34;
      if (*(int *)(cs[1].tb_jmp_cache + 0x57c) != 1) {
        lVar16 = lVar13;
      }
      uVar10 = *(uint *)((long)cs[1].tb_jmp_cache + lVar16 + 0x2058);
      AVar8 = arm_v7m_mmu_idx_for_secstate_aarch64(pCVar17,true);
      tVar11 = helper_le_ldul_mmu_aarch64(pCVar17,(ulong)uVar10,AVar8 & 7,0);
      local_40 = pCVar17;
      tVar12 = helper_le_ldul_mmu_aarch64(pCVar17,(ulong)(uVar10 + 4),AVar8 & 7,0);
      pCVar17 = local_40;
      if ((*(int *)(cs[1].tb_jmp_cache + 0x579) == 0 && (tVar12 & 0x1ff) == 0) ||
         ((*(int *)(cs[1].tb_jmp_cache + 0x579) == 1 && ((tVar12 & 0x1ff) != 0)))) {
        *(uint *)((long)cs[1].tb_jmp_cache + lVar16 + 0x2058) = uVar10 + 8;
        switch_v7m_security_state(local_40,true);
        *(uint *)(cs[1].tb_jmp_cache + 0x579) = (uint)tVar12 & 0x1ff;
        *(uint *)(cs[1].tb_jmp_cache + 0x572) =
             (uint)tVar12 >> 0x11 & 8 | *(uint *)(cs[1].tb_jmp_cache + 0x572) & 0xfffffff7;
        *(undefined4 *)((long)cs[1].tb_jmp_cache + 0x227c) = 0;
        *(uint *)(cs[1].tb_jmp_cache + 0x44f) = (uint)tVar11 & 1;
        *(uint *)((long)cs[1].tb_jmp_cache + 0x2094) = (uint)tVar11 & 0xfffffffe;
        arm_rebuild_hflags_aarch64(pCVar17);
        return;
      }
      puVar3 = (uint *)((long)cs[1].tb_jmp_cache +
                       (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c) * 4 + 0x2b9c);
      *puVar3 = *puVar3 | 0x40000;
      break;
    case 0x10:
      *(uint *)((long)cs[1].tb_jmp_cache + 0x2094) =
           *(int *)((long)cs[1].tb_jmp_cache + 0x2094) +
           (uint)(*(int *)(cs[1].tb_jmp_cache + 0x44f) == 0) * 2 + 2;
      return;
    case 0x11:
      if (*(int *)(cs[1].tb_jmp_cache + 0x587) == 3) {
        lVar13 = 1;
      }
      else {
        lVar13 = (long)*(int *)(cs[1].tb_jmp_cache + 0x57c);
      }
      pbVar2 = (byte *)((long)cs[1].tb_jmp_cache + lVar13 * 4 + 0x2b9e);
      *pbVar2 = *pbVar2 | 8;
      break;
    case 0x12:
      puVar3 = (uint *)((long)cs[1].tb_jmp_cache +
                       (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c) * 4 + 0x2b9c);
      *puVar3 = *puVar3 | 0x20000;
      break;
    case 0x13:
      puVar3 = (uint *)((long)cs[1].tb_jmp_cache +
                       (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c) * 4 + 0x2b9c);
      *puVar3 = *puVar3 | 0x100000;
      break;
    case 0x15:
      pbVar2 = (byte *)((long)cs[1].tb_jmp_cache + 0x2bac);
      *pbVar2 = *pbVar2 | 0x80;
      break;
    case 0x16:
      puVar3 = (uint *)((long)cs[1].tb_jmp_cache +
                       (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c) * 4 + 0x2b9c);
      *puVar3 = *puVar3 | 0x1000000;
    }
    uVar7 = xpsr_read(pCVar17);
    uVar10 = *(uint *)((long)cs[1].tb_jmp_cache + 0x208c);
    AVar8 = arm_mmu_idx_aarch64(pCVar17);
    uVar19 = *(uint *)((long)cs[1].tb_jmp_cache + 0x2c24);
    local_48 = (ARMCPU_conflict1 *)0xffffffffffffffe0;
    local_4c = 0x10;
    uVar18 = 0x10;
    if (((*(uint *)(cs[1].tb_jmp_cache + 0x572) & 4) != 0) &&
       ((uVar19 & 0x400) != 0 || *(int *)(cs[1].tb_jmp_cache + 0x57c) != 0)) {
      if ((*(int *)(cs[1].tb_jmp_cache + 0x57c) == 0) ||
         ((*(byte *)((long)cs[1].tb_jmp_cache + 0x2c13) & 4) == 0)) {
        local_48 = (ARMCPU_conflict1 *)0xffffffffffffff98;
        uVar18 = local_4c;
      }
      else {
        local_48 = (ARMCPU_conflict1 *)0xffffff58;
        local_4c = 0x20;
        uVar18 = local_4c;
      }
    }
    local_4c = uVar18;
    local_38 = (TranslationBlock **)CONCAT44(local_38._4_4_,uVar19);
    local_5c = uVar7;
    if ((uVar10 & 4) == 0) {
      uVar14 = (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c);
    }
    else {
      uVar14 = (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c);
      if ((*(byte *)((long)cs[1].tb_jmp_cache + uVar14 * 4 + 0x2b95) & 2) != 0) {
        uVar10 = uVar10 - 4;
        local_5c = uVar7 | 0x200;
      }
    }
    uVar19 = (*(uint *)(cs[1].tb_jmp_cache + 0x572) & 8) << 0x11;
    if ((int)uVar14 == 0) {
      uVar19 = 0;
    }
    uVar18 = uVar10 + (int)local_48;
    local_58 = (ulong)uVar18;
    if (((*(byte *)((long)cs[1].tb_jmp_cache + 0x508b) & 8) == 0) ||
       (uVar7 = v7m_sp_limit(pCVar17), uVar7 <= uVar18)) {
      uVar15 = 0;
      _Var5 = v7m_stack_write((ARMCPU_conflict1 *)cs,uVar18,
                              *(uint32_t *)(cs[1].tb_jmp_cache + 0x40b),AVar8,STACK_NORMAL);
      _Var6 = false;
      if (_Var5) {
        uVar15 = 0;
        _Var5 = v7m_stack_write((ARMCPU_conflict1 *)cs,(int)local_58 + 4,
                                *(uint32_t *)((long)cs[1].tb_jmp_cache + 0x205c),AVar8,STACK_NORMAL)
        ;
        _Var6 = false;
        if (_Var5) {
          uVar15 = 0;
          _Var5 = v7m_stack_write((ARMCPU_conflict1 *)cs,(int)local_58 + 8,
                                  *(uint32_t *)(cs[1].tb_jmp_cache + 0x40c),AVar8,STACK_NORMAL);
          _Var6 = false;
          if (_Var5) {
            uVar15 = 0;
            _Var5 = v7m_stack_write((ARMCPU_conflict1 *)cs,(int)local_58 + 0xc,
                                    *(uint32_t *)((long)cs[1].tb_jmp_cache + 0x2064),AVar8,
                                    STACK_NORMAL);
            _Var6 = false;
            if (_Var5) {
              uVar15 = 0;
              _Var5 = v7m_stack_write((ARMCPU_conflict1 *)cs,(int)local_58 + 0x10,
                                      *(uint32_t *)(cs[1].tb_jmp_cache + 0x411),AVar8,STACK_NORMAL);
              _Var6 = false;
              if (_Var5) {
                uVar15 = 0;
                _Var5 = v7m_stack_write((ARMCPU_conflict1 *)cs,(int)local_58 + 0x14,
                                        *(uint32_t *)(cs[1].tb_jmp_cache + 0x412),AVar8,STACK_NORMAL
                                       );
                _Var6 = false;
                if (_Var5) {
                  uVar15 = 0;
                  _Var5 = v7m_stack_write((ARMCPU_conflict1 *)cs,(int)local_58 + 0x18,
                                          *(uint32_t *)((long)cs[1].tb_jmp_cache + 0x2094),AVar8,
                                          STACK_NORMAL);
                  _Var6 = false;
                  if (_Var5) {
                    uVar15 = 0;
                    _Var6 = v7m_stack_write((ARMCPU_conflict1 *)cs,(int)local_58 + 0x1c,
                                            local_5c & 0xffefffff | uVar19,AVar8,STACK_NORMAL);
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      pbVar2 = (byte *)((long)cs[1].tb_jmp_cache + uVar14 * 4 + 0x2b9e);
      *pbVar2 = *pbVar2 | 0x10;
      *(uint32_t *)((long)cs[1].tb_jmp_cache + 0x208c) = uVar7;
      uVar15 = (undefined4)CONCAT71((int7)(uVar14 >> 8),1);
      _Var6 = false;
    }
    local_5c = uVar15;
    if (((ulong)cs[1].tb_jmp_cache[0x572] & 4) != 0) {
      if (((*(byte *)((long)cs[1].tb_jmp_cache +
                     (ulong)(*(uint *)(cs[1].tb_jmp_cache + 0x582) & 4) + 0x2c0c) & 1) == 0) ||
         ((*(byte *)((long)cs[1].tb_jmp_cache + 0x508c) & 0x20) == 0)) {
        uVar19 = *(uint *)(cs[1].tb_jmp_cache + 0x57c);
        if (((ulong)local_38 & 0x400) == 0 && uVar19 == 0) {
          pbVar2 = (byte *)((long)cs[1].tb_jmp_cache + 0x2ba2);
          *pbVar2 = *pbVar2 | 8;
        }
        else if ((*(uint *)(cs[1].tb_jmp_cache + 0x582) >> 0x1e & 1) == 0) {
          iVar9 = arm_current_el(pCVar17);
          local_5d = v7m_cpacr_pass(pCVar17,(ulong)uVar19 != 0,iVar9 != 0);
          if ((!(bool)local_5d) && (_Var6 == true)) {
            pbVar2 = (byte *)((long)cs[1].tb_jmp_cache + (ulong)uVar19 * 4 + 0x2b9e);
            *pbVar2 = *pbVar2 | 8;
            _Var6 = false;
          }
          local_38 = cs[1].tb_jmp_cache + 0x58d;
          uVar18 = 0;
          uVar7 = uVar10 + (int)local_48 + 0x20;
          local_48 = (ARMCPU_conflict1 *)cs;
          local_40 = pCVar17;
          for (uVar19 = 0; pCVar17 = local_40, cs = &local_48->parent_obj, uVar19 < local_4c;
              uVar19 = uVar19 + 2) {
            addr = uVar7;
            if (0xf < uVar19) {
              addr = uVar7 + 8;
            }
            if (_Var6 == false) {
              _Var6 = false;
            }
            else {
              pTVar4 = local_38[(ulong)(uVar19 >> 2) * 0x20 + (ulong)(uVar18 & 1)];
              _Var6 = false;
              _Var5 = v7m_stack_write(local_48,addr,(uint32_t)pTVar4,AVar8,STACK_NORMAL);
              if (_Var5) {
                _Var6 = v7m_stack_write(local_48,addr + 4,(uint32_t)((ulong)pTVar4 >> 0x20),AVar8,
                                        STACK_NORMAL);
              }
            }
            uVar18 = uVar18 + 1;
            uVar7 = uVar7 + 8;
          }
          if (_Var6 != false) {
            iVar9 = (int)local_58;
            uVar7 = vfp_get_fpscr_aarch64(local_40);
            v7m_stack_write((ARMCPU_conflict1 *)cs,iVar9 + 0x60,uVar7,AVar8,STACK_NORMAL);
          }
          if (local_5d != '\0') {
            uVar10 = 0;
            for (uVar19 = 0; uVar19 < local_4c; uVar19 = uVar19 + 2) {
              local_38[(ulong)(uVar19 >> 2) * 0x20 + (ulong)(uVar10 & 1)] = (TranslationBlock *)0x0;
              uVar10 = uVar10 + 1;
            }
            vfp_set_fpscr_aarch64(pCVar17,0);
          }
        }
      }
      else {
        pbVar2 = (byte *)((long)cs[1].tb_jmp_cache + 0x2bac);
        *pbVar2 = *pbVar2 | 0x80;
      }
    }
    if ((char)local_5c == '\0') {
      (((ARMCPU_conflict1 *)cs)->env).regs[0xd] = (uint32_t)local_58;
    }
    return;
  }
switchD_005b615b_caseD_6:
  cpu_abort_aarch64(cs,"Unhandled exception 0x%x\n");
}

Assistant:

void arm_v7m_cpu_do_interrupt(CPUState *cs)
{
    ARMCPU *cpu = ARM_CPU(cs);
    CPUARMState *env = &cpu->env;
    uint32_t lr;
    bool ignore_stackfaults;

    // arm_log_exception(cs->exception_index);

    /*
     * For exceptions we just mark as pending on the NVIC, and let that
     * handle it.
     */
    switch (cs->exception_index) {
    case EXCP_UDEF:
        armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_USAGE, env->v7m.secure);
        env->v7m.cfsr[env->v7m.secure] |= R_V7M_CFSR_UNDEFINSTR_MASK;
        break;
    case EXCP_NOCP:
    {
        /*
         * NOCP might be directed to something other than the current
         * security state if this fault is because of NSACR; we indicate
         * the target security state using exception.target_el.
         */
        int target_secstate;

        if (env->exception.target_el == 3) {
            target_secstate = M_REG_S;
        } else {
            target_secstate = env->v7m.secure;
        }
        armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_USAGE, target_secstate);
        env->v7m.cfsr[target_secstate] |= R_V7M_CFSR_NOCP_MASK;
        break;
    }
    case EXCP_INVSTATE:
        armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_USAGE, env->v7m.secure);
        env->v7m.cfsr[env->v7m.secure] |= R_V7M_CFSR_INVSTATE_MASK;
        break;
    case EXCP_STKOF:
        armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_USAGE, env->v7m.secure);
        env->v7m.cfsr[env->v7m.secure] |= R_V7M_CFSR_STKOF_MASK;
        break;
    case EXCP_LSERR:
        armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_SECURE, false);
        env->v7m.sfsr |= R_V7M_SFSR_LSERR_MASK;
        break;
    case EXCP_UNALIGNED:
        armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_USAGE, env->v7m.secure);
        env->v7m.cfsr[env->v7m.secure] |= R_V7M_CFSR_UNALIGNED_MASK;
        break;
    case EXCP_SWI:
        /* The PC already points to the next instruction.  */
        armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_SVC, env->v7m.secure);
        break;
    case EXCP_PREFETCH_ABORT:
    case EXCP_DATA_ABORT:
        /*
         * Note that for M profile we don't have a guest facing FSR, but
         * the env->exception.fsr will be populated by the code that
         * raises the fault, in the A profile short-descriptor format.
         */
        switch (env->exception.fsr & 0xf) {
        case M_FAKE_FSR_NSC_EXEC:
            /*
             * Exception generated when we try to execute code at an address
             * which is marked as Secure & Non-Secure Callable and the CPU
             * is in the Non-Secure state. The only instruction which can
             * be executed like this is SG (and that only if both halves of
             * the SG instruction have the same security attributes.)
             * Everything else must generate an INVEP SecureFault, so we
             * emulate the SG instruction here.
             */
            if (v7m_handle_execute_nsc(cpu)) {
                return;
            }
            break;
        case M_FAKE_FSR_SFAULT:
            /*
             * Various flavours of SecureFault for attempts to execute or
             * access data in the wrong security state.
             */
            switch (cs->exception_index) {
            case EXCP_PREFETCH_ABORT:
                if (env->v7m.secure) {
                    env->v7m.sfsr |= R_V7M_SFSR_INVTRAN_MASK;
                    qemu_log_mask(CPU_LOG_INT,
                                  "...really SecureFault with SFSR.INVTRAN\n");
                } else {
                    env->v7m.sfsr |= R_V7M_SFSR_INVEP_MASK;
                    qemu_log_mask(CPU_LOG_INT,
                                  "...really SecureFault with SFSR.INVEP\n");
                }
                break;
            case EXCP_DATA_ABORT:
                /* This must be an NS access to S memory */
                env->v7m.sfsr |= R_V7M_SFSR_AUVIOL_MASK;
                qemu_log_mask(CPU_LOG_INT,
                              "...really SecureFault with SFSR.AUVIOL\n");
                break;
            }
            armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_SECURE, false);
            break;
        case 0x8: /* External Abort */
            switch (cs->exception_index) {
            case EXCP_PREFETCH_ABORT:
                env->v7m.cfsr[M_REG_NS] |= R_V7M_CFSR_IBUSERR_MASK;
                qemu_log_mask(CPU_LOG_INT, "...with CFSR.IBUSERR\n");
                break;
            case EXCP_DATA_ABORT:
                env->v7m.cfsr[M_REG_NS] |=
                    (R_V7M_CFSR_PRECISERR_MASK | R_V7M_CFSR_BFARVALID_MASK);
                env->v7m.bfar = env->exception.vaddress;
                qemu_log_mask(CPU_LOG_INT,
                              "...with CFSR.PRECISERR and BFAR 0x%x\n",
                              env->v7m.bfar);
                break;
            }
            armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_BUS, false);
            break;
        default:
            /*
             * All other FSR values are either MPU faults or "can't happen
             * for M profile" cases.
             */
            switch (cs->exception_index) {
            case EXCP_PREFETCH_ABORT:
                env->v7m.cfsr[env->v7m.secure] |= R_V7M_CFSR_IACCVIOL_MASK;
                qemu_log_mask(CPU_LOG_INT, "...with CFSR.IACCVIOL\n");
                break;
            case EXCP_DATA_ABORT:
                env->v7m.cfsr[env->v7m.secure] |=
                    (R_V7M_CFSR_DACCVIOL_MASK | R_V7M_CFSR_MMARVALID_MASK);
                env->v7m.mmfar[env->v7m.secure] = env->exception.vaddress;
                qemu_log_mask(CPU_LOG_INT,
                              "...with CFSR.DACCVIOL and MMFAR 0x%x\n",
                              env->v7m.mmfar[env->v7m.secure]);
                break;
            }
            armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_MEM,
                                    env->v7m.secure);
            break;
        }
        break;
    case EXCP_SEMIHOST:
        qemu_log_mask(CPU_LOG_INT,
                      "...handling as semihosting call 0x%x\n",
                      env->regs[0]);
        // env->regs[0] = do_arm_semihosting(env); FIXME
        env->regs[15] += env->thumb ? 2 : 4;
        return;
    case EXCP_BKPT:
        armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_DEBUG, false);
        break;
    case EXCP_IRQ:
        break;
    case EXCP_EXCEPTION_EXIT:
        if (env->regs[15] < EXC_RETURN_MIN_MAGIC) {
            /* Must be v8M security extension function return */
            assert(env->regs[15] >= FNC_RETURN_MIN_MAGIC);
            assert(arm_feature(env, ARM_FEATURE_M_SECURITY));
            if (do_v7m_function_return(cpu)) {
                return;
            }
        } else {
            do_v7m_exception_exit(cpu);
            return;
        }
        break;
    case EXCP_LAZYFP:
        /*
         * We already pended the specific exception in the NVIC in the
         * v7m_preserve_fp_state() helper function.
         */
        break;
    default:
        cpu_abort(cs, "Unhandled exception 0x%x\n", cs->exception_index);
        return; /* Never happens.  Keep compiler happy.  */
    }

    if (arm_feature(env, ARM_FEATURE_V8)) {
        lr = R_V7M_EXCRET_RES1_MASK |
            R_V7M_EXCRET_DCRS_MASK;
        /*
         * The S bit indicates whether we should return to Secure
         * or NonSecure (ie our current state).
         * The ES bit indicates whether we're taking this exception
         * to Secure or NonSecure (ie our target state). We set it
         * later, in v7m_exception_taken().
         * The SPSEL bit is also set in v7m_exception_taken() for v8M.
         * This corresponds to the ARM ARM pseudocode for v8M setting
         * some LR bits in PushStack() and some in ExceptionTaken();
         * the distinction matters for the tailchain cases where we
         * can take an exception without pushing the stack.
         */
        if (env->v7m.secure) {
            lr |= R_V7M_EXCRET_S_MASK;
        }
    } else {
        lr = R_V7M_EXCRET_RES1_MASK |
            R_V7M_EXCRET_S_MASK |
            R_V7M_EXCRET_DCRS_MASK |
            R_V7M_EXCRET_ES_MASK;
        if (env->v7m.control[M_REG_NS] & R_V7M_CONTROL_SPSEL_MASK) {
            lr |= R_V7M_EXCRET_SPSEL_MASK;
        }
    }
    if (!(env->v7m.control[M_REG_S] & R_V7M_CONTROL_FPCA_MASK)) {
        lr |= R_V7M_EXCRET_FTYPE_MASK;
    }
    if (!arm_v7m_is_handler_mode(env)) {
        lr |= R_V7M_EXCRET_MODE_MASK;
    }

    ignore_stackfaults = v7m_push_stack(cpu);
    v7m_exception_taken(cpu, lr, false, ignore_stackfaults);
}